

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
anon_unknown.dwarf_974be2::GetValue
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmExecutionStatus *status,string *key,string *variable)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view sVar1;
  undefined8 this;
  bool bVar2;
  byte bVar3;
  int iVar4;
  pointer ppVar5;
  cmExecutionStatus *status_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Self local_1c8;
  _Self local_1c0;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  undefined1 local_120 [8];
  string cmake_var_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *kv;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string vars;
  undefined1 local_90 [8];
  string subkey;
  cmMakefile *makefile;
  undefined1 local_38 [8];
  static_string_view prefix;
  string *variable_local;
  string *key_local;
  cmExecutionStatus *status_local;
  
  prefix.super_string_view._M_str = (char *)variable;
  _local_38 = (string_view)::cm::operator____s("DISTRIB_",8);
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
  bVar2 = cmHasPrefix(sVar1,_local_38);
  if (bVar2) {
    if ((anonymous_namespace)::
        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
        s_os_release_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::s_os_release_abi_cxx11_);
      if (iVar4 != 0) {
        (anonymous_namespace)::GetOSReleaseVariables_abi_cxx11_
                  (&(anonymous_namespace)::
                    GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                    ::s_os_release_abi_cxx11_,(_anonymous_namespace_ *)status,status_00);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::~map,&(anonymous_namespace)::
                             GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                             ::s_os_release_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                             ::s_os_release_abi_cxx11_);
      }
    }
    subkey.field_2._8_8_ = cmExecutionStatus::GetMakefile(status);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    std::__cxx11::string::size();
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    std::__cxx11::string::substr((ulong)local_90,(ulong)key);
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
    __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("INFO",4);
    vars.field_2._8_8_ = __y._M_len;
    bVar2 = std::operator==(__x,__y);
    if (bVar2) {
      std::__cxx11::string::string((string *)&__range2);
      __end2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&(anonymous_namespace)::
                        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                        ::s_os_release_abi_cxx11_);
      kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&(anonymous_namespace)::
                     GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                     ::s_os_release_abi_cxx11_);
      while( true ) {
        bVar2 = std::operator!=(&__end2,(_Self *)&kv);
        if (!bVar2) break;
        cmake_var_name.field_2._8_8_ =
             std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end2);
        cmAlphaNum::cmAlphaNum(&local_150,(string *)prefix.super_string_view._M_str);
        cmAlphaNum::cmAlphaNum(&local_180,'_');
        cmStrCat<std::__cxx11::string>
                  ((string *)local_120,&local_150,&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmake_var_name.field_2._8_8_);
        bVar3 = std::__cxx11::string::empty();
        std::operator+(&local_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((anonymous_namespace)::DELIM_abi_cxx11_ + (ulong)(bVar3 ^ 1) * 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120);
        std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        this = subkey.field_2._8_8_;
        sVar1 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(cmake_var_name.field_2._8_8_ + 0x20));
        cmMakefile::AddDefinition((cmMakefile *)this,(string *)local_120,sVar1);
        std::__cxx11::string::~string((string *)local_120);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2);
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
      it._M_node._4_4_ = 1;
      std::__cxx11::string::~string((string *)&__range2);
    }
    else {
      local_1c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&(anonymous_namespace)::
                   GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::s_os_release_abi_cxx11_,(key_type *)local_90);
      local_1c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::cend(&(anonymous_namespace)::
                   GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::s_os_release_abi_cxx11_);
      bVar2 = std::operator!=(&local_1c0,&local_1c8);
      if (bVar2) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_1c0);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (__return_storage_ptr__,&ppVar5->second);
        it._M_node._4_4_ = 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_1e8);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        it._M_node._4_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> GetValue(cmExecutionStatus& status,
                                   std::string const& key,
                                   std::string const& variable)
{
  const auto prefix = "DISTRIB_"_s;
  if (!cmHasPrefix(key, prefix)) {
    return {};
  }

  static const std::map<std::string, std::string> s_os_release =
    GetOSReleaseVariables(status);

  auto& makefile = status.GetMakefile();

  const std::string subkey =
    key.substr(prefix.size(), key.size() - prefix.size());
  if (subkey == "INFO"_s) {
    std::string vars;
    for (const auto& kv : s_os_release) {
      auto cmake_var_name = cmStrCat(variable, '_', kv.first);
      vars += DELIM[!vars.empty()] + cmake_var_name;
      makefile.AddDefinition(cmake_var_name, kv.second);
    }
    return cm::optional<std::string>(std::move(vars));
  }

  // Query individual variable
  const auto it = s_os_release.find(subkey);
  if (it != s_os_release.cend()) {
    return it->second;
  }

  // NOTE Empty string means requested variable not set
  return std::string{};
}